

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Conflict_Map::delete_edge(Conflict_Map *this,VarId *var1,VarId *var2)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  value_type *in_RDX;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_RSI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RDI;
  bool bVar7;
  size_type size2;
  size_type size1;
  key_type *in_stack_fffffffffffffed8;
  mapped_type *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  byte bVar8;
  undefined1 in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff19;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  
  sVar1 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(in_RSI,(key_type *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  bVar7 = false;
  if (sVar1 != 0) {
    sVar1 = std::
            map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::count(in_RSI,(key_type *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
                   );
    bVar7 = sVar1 != 0;
  }
  if (bVar7) {
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
    sVar2 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1b5652);
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
    sVar3 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1b5675);
    std::
    map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type_conflict *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18))
    ;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    erase(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::
    map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type_conflict *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18))
    ;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    erase(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::
    map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type_conflict *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18))
    ;
    sVar4 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)0x1b5717);
    if (sVar4 == 0) {
      std::
      map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::erase((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_fffffffffffffee0,(key_type_conflict *)in_stack_fffffffffffffed8);
    }
    sVar5 = std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::count((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                     *)in_RSI,
                    (key_type_conflict *)
                    CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    bVar8 = 0;
    if (sVar5 != 0) {
      std::
      map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (key_type_conflict *)
                   CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
      sVar4 = std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::size((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)0x1b57b5);
      bVar8 = sVar4 != 0 ^ 0xff;
    }
    if ((bVar8 & 1) != 0) {
      std::
      map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::erase((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_fffffffffffffee0,(key_type_conflict *)in_stack_fffffffffffffed8);
    }
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    erase(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (key_type *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    erase(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (sVar2 != 0) {
      sVar5 = std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_RSI,(key_type_conflict *)CONCAT17(bVar8,in_stack_fffffffffffffee8));
      if (sVar5 == 0) {
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x1b58a9);
        in_stack_fffffffffffffee0 =
             std::
             map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          (key_type_conflict *)
                          CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        operator=(in_stack_fffffffffffffee0,
                  (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffffed8);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b58f8);
      }
      std::
      map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (key_type_conflict *)
                   CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_RDI,in_RDX);
    }
    if (sVar3 != 0) {
      sVar5 = std::
              map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_RSI,(key_type_conflict *)CONCAT17(bVar8,in_stack_fffffffffffffee8));
      if (sVar5 == 0) {
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )0x1b59ce);
        in_stack_ffffffffffffff24 = (int)sVar3 + -1;
        pmVar6 = std::
                 map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (key_type_conflict *)
                              CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        operator=(in_stack_fffffffffffffee0,pmVar6);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b5a0f);
      }
      std::
      map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::operator[]((map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff24,(int)sVar3 + -1),
                   (key_type_conflict *)
                   CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18));
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      insert(in_RDI,in_RDX);
    }
    return;
  }
  __assert_fail("dynamic_Map.count(var1) && dynamic_Map.count(var2)",
                "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                ,0xaa,
                "void optimization::graph_color::Conflict_Map::delete_edge(mir::inst::VarId, mir::inst::VarId)"
               );
}

Assistant:

void delete_edge(mir::inst::VarId var1, mir::inst::VarId var2) {
    assert(dynamic_Map.count(var1) && dynamic_Map.count(var2));
    auto size1 = dynamic_Map[var1].size();
    auto size2 = dynamic_Map[var2].size();
    edge_vars[size1].erase(var1);
    edge_vars[size2].erase(var2);
    if (!edge_vars[size1].size()) {
      edge_vars.erase(size1);
    }
    if (edge_vars.count(size2) && !edge_vars[size2].size()) {
      edge_vars.erase(size2);
    }
    dynamic_Map[var1].erase(var2);
    dynamic_Map[var2].erase(var1);
    if (size1 >= 1) {
      if (!edge_vars.count(size1 - 1)) {
        edge_vars[size1 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size1 - 1].insert(var1);
    }
    if (size2 >= 1) {
      if (!edge_vars.count(size2 - 1)) {
        edge_vars[size2 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size2 - 1].insert(var2);
    }
  }